

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef ConvertToStackType(LlvmCompilationContext *ctx,LLVMValueRef value,TypeBase *valueType)

{
  ExpressionContext *pEVar1;
  long lVar2;
  
  pEVar1 = ctx->ctx;
  lVar2 = 0x89d8;
  if (((pEVar1->typeBool != valueType) && (pEVar1->typeChar != valueType)) &&
     (pEVar1->typeShort != valueType)) {
    if (pEVar1->typeFloat != valueType) {
      return value;
    }
    lVar2 = 0x89f0;
  }
  CompileLlvmType(ctx,*(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar2 + -0x30));
  return (LLVMValueRef)&placeholderValue;
}

Assistant:

LLVMValueRef ConvertToStackType(LlvmCompilationContext &ctx, LLVMValueRef value, TypeBase *valueType)
{
	if(valueType == ctx.ctx.typeBool)
		return LLVMBuildZExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeChar)
		return LLVMBuildSExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeShort)
		return LLVMBuildSExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeFloat)
		return LLVMBuildFPCast(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeDouble), "");

	return value;
}